

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::javanano::ClassName_abi_cxx11_
          (string *__return_storage_ptr__,javanano *this,Params *params,FileDescriptor *descriptor)

{
  ulong uVar1;
  string local_58;
  undefined1 local_21;
  Params *local_20;
  FileDescriptor *descriptor_local;
  Params *params_local;
  string *result;
  
  local_21 = 0;
  local_20 = params;
  descriptor_local = (FileDescriptor *)this;
  params_local = (Params *)__return_storage_ptr__;
  FileJavaPackage_abi_cxx11_(__return_storage_ptr__,this,params,descriptor);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'.');
  }
  FileClassName_abi_cxx11_(&local_58,(javanano *)descriptor_local,local_20,descriptor);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

string ClassName(const Params& params, const FileDescriptor* descriptor) {
  string result = FileJavaPackage(params, descriptor);
  if (!result.empty()) result += '.';
  result += FileClassName(params, descriptor);
  return result;
}